

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

int __thiscall Directory::remove(Directory *this,char *__filename)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  undefined7 extraout_var;
  long *plVar5;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (this->path)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->path)._M_string_length);
  std::__cxx11::string::append((char *)local_40);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_40,*(ulong *)__filename);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  iVar3 = ::remove((char *)local_60);
  if (iVar3 == 0) {
    bVar2 = refresh(this);
    iVar3 = (int)CONCAT71(extraout_var,bVar2);
  }
  else {
    iVar3 = 0;
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  return iVar3;
}

Assistant:

bool Directory::remove(std::string name)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	return (!::remove(fullPath.c_str()) && refresh());
#else
	return (!_unlink(fullPath.c_str()) && refresh());
#endif
}